

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::StructMemberRef::StructMemberRef
          (StructMemberRef *this,Context *c,Expression *o,StructurePtr *s,string *member)

{
  Structure *pSVar1;
  
  Expression::Expression(&this->super_Expression,StructMemberRef,c,value);
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__StructMemberRef_002f9550;
  (this->object).object = o;
  pSVar1 = s->object;
  (this->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  std::__cxx11::string::string((string *)&this->memberName,(string *)member);
  if (((((this->object).object)->kind & ~unknown) == value) &&
     ((this->structure).object != (Structure *)0x0)) {
    return;
  }
  throwInternalCompilerError
            ("isPossiblyValue (object.get()) && structure != nullptr","StructMemberRef",0x9e4);
}

Assistant:

StructMemberRef (const Context& c, Expression& o, StructurePtr s, std::string member)
            : Expression (ObjectType::StructMemberRef, c, ExpressionKind::value),
              object (o), structure (s), memberName (std::move (member))
        {
            SOUL_ASSERT (isPossiblyValue (object.get()) && structure != nullptr);
        }